

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall curlpp::FormParts::File::File(File *this,char *name,char *filename)

{
  char *in_RDX;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffffd8;
  FormPart *in_stack_ffffffffffffffe0;
  
  FormPart::FormPart(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *in_RDI = &PTR__File_00162ba8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RDX,(allocator *)&stack0xffffffffffffffe7);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  std::__cxx11::string::string((string *)(in_RDI + 9));
  return;
}

Assistant:

curlpp::FormParts::File::File(const char * name, const char * filename)
  : FormPart(name)
  , mFilename(filename)
{}